

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

size_t asmjit::v1_14::JitAllocatorImpl_calculateIdealBlockSize
                 (JitAllocatorPrivateImpl *impl,JitAllocatorPool *pool,size_t allocationSize)

{
  bool bVar1;
  ulong in_RDX;
  long in_RSI;
  JitAllocatorOptions *in_RDI;
  size_t granularity;
  size_t blockSize;
  JitAllocatorBlock *last;
  ulong local_58;
  ulong local_48;
  ulong local_38;
  ulong local_20;
  
  if (*(JitAllocatorBlock **)(in_RSI + 8) == (JitAllocatorBlock *)0x0) {
    local_58 = (ulong)in_RDI[1];
  }
  else {
    local_58 = JitAllocatorBlock::blockSize(*(JitAllocatorBlock **)(in_RSI + 8));
  }
  local_48 = local_58;
  bVar1 = Support::test<asmjit::v1_14::JitAllocatorOptions,asmjit::v1_14::JitAllocatorOptions>
                    (*in_RDI,kDisableInitialPadding);
  local_38 = in_RDX;
  if (!bVar1) {
    if (-in_RDX - 1 < (ulong)*(ushort *)(in_RSI + 0x1c)) {
      return 0;
    }
    local_38 = *(ushort *)(in_RSI + 0x1c) + in_RDX;
  }
  if (local_58 < 0x4000000) {
    local_48 = local_58 << 1;
  }
  if ((local_48 < local_38) &&
     (local_48 = local_38 + ((ulong)in_RDI[1] - 1) & ((ulong)in_RDI[1] - 1 ^ 0xffffffffffffffff),
     local_48 < local_38)) {
    local_20 = 0;
  }
  else {
    local_20 = local_48;
  }
  return local_20;
}

Assistant:

static inline size_t JitAllocatorImpl_calculateIdealBlockSize(JitAllocatorPrivateImpl* impl, JitAllocatorPool* pool, size_t allocationSize) noexcept {
  JitAllocatorBlock* last = pool->blocks.last();
  size_t blockSize = last ? last->blockSize() : size_t(impl->blockSize);

  // We have to increase the allocationSize if we know that the block must provide padding.
  if (!Support::test(impl->options, JitAllocatorOptions::kDisableInitialPadding)) {
    size_t granularity = pool->granularity;
    if (SIZE_MAX - allocationSize < granularity)
      return 0; // Overflown
    allocationSize += granularity;
  }

  if (blockSize < kJitAllocatorMaxBlockSize)
    blockSize *= 2u;

  if (allocationSize > blockSize) {
    blockSize = Support::alignUp(allocationSize, impl->blockSize);
    if (ASMJIT_UNLIKELY(blockSize < allocationSize))
      return 0; // Overflown.
  }

  return blockSize;
}